

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowReturnOneRow(Parse *pParse,Window *pMWin,int regGosub,int addrGosub)

{
  FuncDef *pFVar1;
  int iVar2;
  int iVar3;
  int p2;
  int p2_00;
  int iVar4;
  int p3;
  Vdbe *p;
  int tmpReg2;
  int op;
  int val;
  int tmpReg_1;
  int lbl_1;
  int csr_1;
  int iEph;
  int nArg;
  int tmpReg;
  int lbl;
  int csr;
  FuncDef *pFunc;
  Window *pWin;
  Vdbe *v;
  int addrGosub_local;
  int regGosub_local;
  Window *pMWin_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  for (pFunc = (FuncDef *)pMWin; pFunc != (FuncDef *)0x0; pFunc = (FuncDef *)pFunc->xInverse) {
    pFVar1 = (pFunc->u).pHash;
    if ((pFVar1->zName == "nth_value") || (pFVar1->zName == "first_value")) {
      iVar4 = *(int *)((long)&pFunc[1].pUserData + 4);
      iVar2 = sqlite3VdbeMakeLabel(p);
      iVar3 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x49,0,*(int *)&pFunc[1].pUserData);
      if (pFVar1->zName == "nth_value") {
        sqlite3VdbeAddOp3(p,0x5a,pMWin->iEphCsr,*(int *)((long)&pFunc[1].xFinalize + 4) + 1,iVar3);
        windowCheckIntValue(pParse,iVar3,2);
      }
      else {
        sqlite3VdbeAddOp2(p,0x46,1,iVar3);
      }
      sqlite3VdbeAddOp3(p,0x60,iVar3,*(int *)&pFunc[1].pNext,iVar3);
      sqlite3VdbeAddOp3(p,0x36,*(int *)&pFunc[1].pNext + 1,iVar2,iVar3);
      sqlite3VdbeAddOp3(p,0x1e,iVar4,0,iVar3);
      sqlite3VdbeAddOp3(p,0x5a,iVar4,*(int *)((long)&pFunc[1].xFinalize + 4),
                        *(int *)&pFunc[1].pUserData);
      sqlite3VdbeResolveLabel(p,iVar2);
      sqlite3ReleaseTempReg(pParse,iVar3);
    }
    else if ((pFVar1->zName == "lead") || (pFVar1->zName == "lag")) {
      iVar4 = **(int **)(pFunc[1].xSFunc + 0x20);
      iVar2 = pMWin->iEphCsr;
      iVar3 = *(int *)((long)&pFunc[1].pUserData + 4);
      p2 = sqlite3VdbeMakeLabel(p);
      p2_00 = sqlite3GetTempReg(pParse);
      if (iVar4 < 3) {
        sqlite3VdbeAddOp2(p,0x49,0,*(int *)&pFunc[1].pUserData);
      }
      else {
        sqlite3VdbeAddOp3(p,0x5a,iVar2,*(int *)((long)&pFunc[1].xFinalize + 4) + 2,
                          *(int *)&pFunc[1].pUserData);
      }
      sqlite3VdbeAddOp2(p,0x81,iVar2,p2_00);
      if (iVar4 < 2) {
        iVar4 = -1;
        if (pFVar1->zName == "lead") {
          iVar4 = 1;
        }
        sqlite3VdbeAddOp2(p,0x53,p2_00,iVar4);
      }
      else {
        iVar4 = 0x61;
        if (pFVar1->zName == "lead") {
          iVar4 = 0x60;
        }
        p3 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(p,0x5a,iVar2,*(int *)((long)&pFunc[1].xFinalize + 4) + 1,p3);
        sqlite3VdbeAddOp3(p,iVar4,p3,p2_00,p2_00);
        sqlite3ReleaseTempReg(pParse,p3);
      }
      sqlite3VdbeAddOp3(p,0x1e,iVar3,p2,p2_00);
      sqlite3VdbeAddOp3(p,0x5a,iVar3,*(int *)((long)&pFunc[1].xFinalize + 4),
                        *(int *)&pFunc[1].pUserData);
      sqlite3VdbeResolveLabel(p,p2);
      sqlite3ReleaseTempReg(pParse,p2_00);
    }
  }
  sqlite3VdbeAddOp2(p,0xc,regGosub,addrGosub);
  return;
}

Assistant:

static void windowReturnOneRow(
  Parse *pParse,
  Window *pMWin,
  int regGosub,
  int addrGosub
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pFunc;
    if( pFunc->zName==nth_valueName
     || pFunc->zName==first_valueName
    ){
      int csr = pWin->csrApp;
      int lbl = sqlite3VdbeMakeLabel(v);
      int tmpReg = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

      if( pFunc->zName==nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+1,tmpReg);
        windowCheckIntValue(pParse, tmpReg, 2);
      }else{
        sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
      }
      sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
      sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
      VdbeCoverageNeverNull(v);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
      VdbeCoverageNeverTaken(v);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
      sqlite3VdbeResolveLabel(v, lbl);
      sqlite3ReleaseTempReg(pParse, tmpReg);
    }
    else if( pFunc->zName==leadName || pFunc->zName==lagName ){
      int nArg = pWin->pOwner->x.pList->nExpr;
      int iEph = pMWin->iEphCsr;
      int csr = pWin->csrApp;
      int lbl = sqlite3VdbeMakeLabel(v);
      int tmpReg = sqlite3GetTempReg(pParse);

      if( nArg<3 ){
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+2, pWin->regResult);
      }
      sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
      if( nArg<2 ){
        int val = (pFunc->zName==leadName ? 1 : -1);
        sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
      }else{
        int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
        int tmpReg2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
        sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
        sqlite3ReleaseTempReg(pParse, tmpReg2);
      }

      sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
      sqlite3VdbeResolveLabel(v, lbl);
      sqlite3ReleaseTempReg(pParse, tmpReg);
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, regGosub, addrGosub);
}